

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# media_test.cpp
# Opt level: O2

void __thiscall
HenyeyGreenstein_SamplingMatch_Test::~HenyeyGreenstein_SamplingMatch_Test
          (HenyeyGreenstein_SamplingMatch_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(HenyeyGreenstein, SamplingMatch) {
    RNG rng;
    for (float g = -.75; g <= 0.75; g += 0.25) {
        HGPhaseFunction hg(g);
        for (int i = 0; i < 100; ++i) {
            Vector3f wo =
                SampleUniformSphere({rng.Uniform<Float>(), rng.Uniform<Float>()});
            Point2f u{rng.Uniform<Float>(), rng.Uniform<Float>()};
            auto ps = hg.Sample_p(wo, u);
            EXPECT_TRUE(ps);
            // Phase function is normalized, and the sampling method should be
            // exact.
            EXPECT_EQ(ps.p, ps.pdf);
            EXPECT_NEAR(ps.p, hg.p(wo, ps.wi), 1e-4f) << "Failure with g = " << g;
        }
    }
}